

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void bcf1_sync_info(bcf1_t *line,kstring_t *str)

{
  bcf_info_t *pbVar1;
  bcf_info_t *pbVar2;
  uint8_t *puVar3;
  bcf_info_t *pbVar4;
  undefined8 uVar5;
  uint8_t *puVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  anon_union_4_2_947300a4_for_v1 aVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  anon_union_4_2_947300a4_for_v1 aVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  size_t __n;
  uint8_t **ppuVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  size_t __size;
  uint uVar23;
  ulong uVar24;
  bcf_info_t tmp;
  
  uVar15 = *(ulong *)&line->field_0x10;
  if ((short)uVar15 == 0) {
    uVar23 = 0xffffffff;
  }
  else {
    uVar24 = 1;
    uVar20 = 0;
    uVar21 = 0xffffffff;
    do {
      pbVar2 = (line->d).info;
      puVar3 = pbVar2[uVar20].vptr;
      uVar22 = uVar21;
      if (puVar3 == (uint8_t *)0x0) {
        if ((int)uVar21 < 0) {
          uVar22 = uVar20 & 0xffffffff;
        }
      }
      else {
        uVar23 = *(uint *)&pbVar2[uVar20].field_0x1c & 0x7fffffff;
        __n = (size_t)(int)(pbVar2[uVar20].vptr_len + uVar23);
        uVar15 = str->l + __n;
        if (str->m < uVar15) {
          uVar15 = uVar15 - 1;
          uVar15 = uVar15 >> 1 | uVar15;
          uVar15 = uVar15 >> 2 | uVar15;
          uVar15 = uVar15 >> 4 | uVar15;
          uVar15 = uVar15 >> 8 | uVar15;
          __size = (uVar15 >> 0x10 | uVar15) + 1;
          str->m = __size;
          pcVar16 = (char *)realloc(str->s,__size);
          if (pcVar16 != (char *)0x0) {
            str->s = pcVar16;
            goto LAB_001255e5;
          }
        }
        else {
LAB_001255e5:
          memcpy(str->s + str->l,puVar3 + -(ulong)uVar23,__n);
          str->l = str->l + __n;
        }
        if (-1 < (int)uVar21) {
          pbVar4 = (line->d).info;
          pbVar2 = pbVar4 + uVar21;
          iVar11 = pbVar2->key;
          iVar12 = pbVar2->type;
          iVar13 = pbVar2->len;
          aVar14 = pbVar2->v1;
          puVar3 = pbVar4[uVar21].vptr;
          uVar5 = (&pbVar4[uVar21].vptr)[1];
          pbVar2 = pbVar4 + uVar20;
          iVar8 = pbVar2->type;
          iVar9 = pbVar2->len;
          aVar10 = pbVar2->v1;
          puVar6 = pbVar4[uVar20].vptr;
          uVar7 = (&pbVar4[uVar20].vptr)[1];
          pbVar1 = pbVar4 + uVar21;
          pbVar1->key = pbVar2->key;
          pbVar1->type = iVar8;
          pbVar1->len = iVar9;
          pbVar1->v1 = aVar10;
          pbVar4[uVar21].vptr = puVar6;
          (&pbVar4[uVar21].vptr)[1] = (uint8_t *)uVar7;
          pbVar2 = (line->d).info;
          ppuVar18 = &pbVar2[uVar20].vptr;
          *ppuVar18 = puVar3;
          ppuVar18[1] = (uint8_t *)uVar5;
          pbVar2 = pbVar2 + uVar20;
          pbVar2->key = iVar11;
          pbVar2->type = iVar12;
          pbVar2->len = iVar13;
          pbVar2->v1 = aVar14;
          if (uVar21 <= uVar20) {
            lVar17 = uVar21 << 0x20;
            ppuVar18 = &(line->d).info[uVar21].vptr;
            do {
              uVar22 = uVar21;
              if (*ppuVar18 == (uint8_t *)0x0) break;
              lVar19 = lVar17 >> 0x20;
              uVar21 = (ulong)((int)uVar21 + 1);
              lVar17 = lVar17 + 0x100000000;
              ppuVar18 = ppuVar18 + 4;
              uVar22 = uVar24;
            } while (lVar19 < (long)uVar20);
          }
        }
      }
      uVar23 = (uint)uVar22;
      uVar20 = uVar20 + 1;
      uVar15 = *(ulong *)&line->field_0x10;
      uVar24 = (ulong)((int)uVar24 + 1);
      uVar21 = uVar22;
    } while (uVar20 < (uVar15 & 0xffff));
  }
  if (-1 < (int)uVar23) {
    *(ulong *)&line->field_0x10 = uVar15 & 0xffffffffffff0000 | (ulong)(uVar23 & 0xffff);
  }
  return;
}

Assistant:

static inline void bcf1_sync_info(bcf1_t *line, kstring_t *str)
{
    // pairs of typed vectors
    int i, irm = -1;
    for (i=0; i<line->n_info; i++)
    {
        bcf_info_t *info = &line->d.info[i];
        if ( !info->vptr )
        {
            // marked for removal
            if ( irm < 0 ) irm = i;
            continue;
        }
        kputsn_(info->vptr - info->vptr_off, info->vptr_len + info->vptr_off, str);
        if ( irm >=0 )
        {
            bcf_info_t tmp = line->d.info[irm]; line->d.info[irm] = line->d.info[i]; line->d.info[i] = tmp;
            while ( irm<=i && line->d.info[irm].vptr ) irm++;
        }
    }
    if ( irm>=0 ) line->n_info = irm;
}